

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall QStyleSheetBorderData::QStyleSheetBorderData(QStyleSheetBorderData *this)

{
  long lVar1;
  
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  lVar1 = 0;
  do {
    QBrush::QBrush((QBrush *)((long)this->borders + lVar1 + 0x14));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  this->radii[2].wd.m_i = -1;
  this->radii[2].ht.m_i = -1;
  this->radii[3].wd.m_i = -1;
  this->radii[3].ht.m_i = -1;
  this->radii[0].wd.m_i = -1;
  this->radii[0].ht.m_i = -1;
  this->radii[1].wd.m_i = -1;
  this->radii[1].ht.m_i = -1;
  (this->bi).d.ptr = (QStyleSheetBorderImageData *)0x0;
  this->borders[0] = 0;
  this->borders[1] = 0;
  this->borders[2] = 0;
  this->borders[3] = 0;
  this->styles[0] = BorderStyle_None;
  this->styles[1] = BorderStyle_None;
  this->styles[2] = BorderStyle_None;
  this->styles[3] = BorderStyle_None;
  return;
}

Assistant:

QStyleSheetBorderData() : bi(nullptr)
    {
        for (int i = 0; i < 4; i++) {
            borders[i] = 0;
            styles[i] = QCss::BorderStyle_None;
        }
    }